

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void write_vec_element(DisasContext_conflict1 *s,TCGv_i64 tcg_src,int destidx,int element,
                      MemOp memop)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  int vect_off;
  TCGContext_conflict1 *tcg_ctx;
  MemOp memop_local;
  int element_local;
  int destidx_local;
  TCGv_i64 tcg_src_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = vec_reg_offset(s,destidx,element,memop & MO_64);
  switch(memop) {
  case MO_8:
    tcg_gen_st8_i64(tcg_ctx_00,tcg_src,tcg_ctx_00->cpu_env,(long)iVar1);
    break;
  case MO_16:
    tcg_gen_st16_i64(tcg_ctx_00,tcg_src,tcg_ctx_00->cpu_env,(long)iVar1);
    break;
  case MO_32:
    tcg_gen_st32_i64(tcg_ctx_00,tcg_src,tcg_ctx_00->cpu_env,(long)iVar1);
    break;
  case MO_64:
    tcg_gen_st_i64_aarch64(tcg_ctx_00,tcg_src,tcg_ctx_00->cpu_env,(long)iVar1);
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x44c,(char *)0x0);
  }
  return;
}

Assistant:

static void write_vec_element(DisasContext *s, TCGv_i64 tcg_src, int destidx,
                              int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, destidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_st8_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_st16_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
        tcg_gen_st32_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_64:
        tcg_gen_st_i64(tcg_ctx, tcg_src, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}